

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O2

void __thiscall chrono::ChDirectSolverLS::ArchiveIN(ChDirectSolverLS *this,ChArchiveIn *marchive)

{
  ChNameValue<bool> local_78;
  ChNameValue<bool> local_60;
  ChNameValue<bool> local_48;
  ChNameValue<bool> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChDirectSolverLS>(marchive);
  ChSolver::ArchiveIN((ChSolver *)this,marchive);
  local_30._value = &this->m_lock;
  local_30._name = "m_lock";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->m_use_learner;
  local_48._name = "m_use_learner";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->m_use_perm;
  local_60._name = "m_use_perm";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->m_use_rhs_sparsity;
  local_78._name = "m_use_rhs_sparsity";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  return;
}

Assistant:

void ChDirectSolverLS::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChDirectSolverLS>();

    // deserialize parent class
    ChSolver::ArchiveIN(marchive);

    // stream in all member data:
    marchive >> CHNVP(m_lock);
    marchive >> CHNVP(m_use_learner);
    marchive >> CHNVP(m_use_perm);
    marchive >> CHNVP(m_use_rhs_sparsity);
}